

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O3

NameSet * __thiscall
wasm::BranchUtils::getUniqueTargets
          (NameSet *__return_storage_ptr__,BranchUtils *this,Expression *expr)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  operateOnScopeNameUses<wasm::BranchUtils::getUniqueTargets(wasm::Expression*)::_lambda(wasm::Name&)_1_>
            (this,(Expression *)__return_storage_ptr__,(anon_class_8_1_ba1d7401)expr);
  return __return_storage_ptr__;
}

Assistant:

inline NameSet getUniqueTargets(Expression* expr) {
  NameSet ret;
  operateOnScopeNameUses(expr, [&](Name& name) { ret.insert(name); });
  return ret;
}